

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

ImportSourcePtr __thiscall libcellml::Importer::importSource(Importer *this,size_t index)

{
  LoggerImpl *pLVar1;
  __shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ImportSourcePtr IVar4;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
  (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
  pLVar1 = Logger::pFunc((Logger *)index);
  _Var3._M_pi = extraout_RDX;
  if (in_RDX < (ulong)((long)pLVar1[1].mMessages.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)pLVar1[1].mMessages.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish >> 4)) {
    pLVar1 = Logger::pFunc((Logger *)index);
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
              ::at((vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
                    *)&pLVar1[1].mMessages.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,in_RDX)->
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    _Var3._M_pi = extraout_RDX_00;
  }
  IVar4.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  IVar4.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ImportSourcePtr)
         IVar4.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImportSourcePtr Importer::importSource(size_t index) const
{
    ImportSourcePtr importSrc = nullptr;
    if (index < pFunc()->mImports.size()) {
        importSrc = pFunc()->mImports.at(index);
    }

    return importSrc;
}